

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_1d382d4::AV1FwdTxfm2d::SetUp(AV1FwdTxfm2d *this)

{
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  ParamType *pPVar4;
  int16_t *piVar5;
  int32_t *piVar6;
  double *pdVar7;
  SEARCH_METHODS *pSVar8;
  double dVar9;
  TXFM_2D_FLIP_CFG fwd_txfm_flip_cfg;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  internal local_60 [8];
  undefined8 *local_58;
  TXFM_2D_FLIP_CFG local_50;
  
  pPVar4 = testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
           GetParam();
  this->tx_type_ =
       (pPVar4->super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_double,_double>).
       super__Tuple_impl<1UL,_unsigned_char,_double,_double>.field_0x11;
  pPVar4 = testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
           GetParam();
  this->tx_size_ =
       (pPVar4->super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_double,_double>).
       super__Tuple_impl<1UL,_unsigned_char,_double,_double>.
       super__Head_base<1UL,_unsigned_char,_false>._M_head_impl;
  pPVar4 = testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
           GetParam();
  this->max_error_ =
       (pPVar4->super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_double,_double>).
       super__Tuple_impl<1UL,_unsigned_char,_double,_double>.super__Tuple_impl<2UL,_double,_double>.
       super__Head_base<2UL,_double,_false>._M_head_impl;
  pPVar4 = testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
           GetParam();
  this->max_avg_error_ =
       (pPVar4->super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_double,_double>).
       super__Tuple_impl<1UL,_unsigned_char,_double,_double>.super__Tuple_impl<2UL,_double,_double>.
       super__Tuple_impl<3UL,_double>.super__Head_base<3UL,_double,_false>._M_head_impl;
  this->count_ = 500;
  av1_get_fwd_txfm_cfg(this->tx_type_,this->tx_size_,&local_50);
  dVar9 = libaom_test::get_amplification_factor(this->tx_type_,this->tx_size_);
  this->amplify_factor_ = dVar9;
  iVar1 = ::tx_size_wide[local_50.tx_size];
  this->tx_width_ = iVar1;
  iVar3 = ::tx_size_high[local_50.tx_size];
  this->tx_height_ = iVar3;
  this->ud_flip_ = local_50.ud_flip;
  this->lr_flip_ = local_50.lr_flip;
  this->fwd_txfm_ = *(FwdTxfm2dFunc *)(libaom_test::fwd_txfm_func_ls + (ulong)this->tx_size_ * 8);
  iVar3 = iVar3 * iVar1;
  this->txfm2d_size_ = iVar3;
  piVar5 = (int16_t *)aom_memalign(0x10,(long)iVar3 * 2);
  this->input_ = piVar5;
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<short*,decltype(nullptr)>
            (local_60,"input_","nullptr",&this->input_,&local_70._M_head_impl);
  puVar2 = local_58;
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58 == (undefined8 *)0x0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = (SEARCH_METHODS *)*local_58;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
               ,0x3b,(char *)pSVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
  }
  else {
    if (local_58 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_58 != local_58 + 2) {
        operator_delete((undefined8 *)*local_58);
      }
      operator_delete(puVar2);
    }
    piVar6 = (int32_t *)aom_memalign(0x10,(long)this->txfm2d_size_ << 2);
    this->output_ = piVar6;
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<int*,decltype(nullptr)>
              (local_60,"output_","nullptr",&this->output_,&local_70._M_head_impl);
    puVar2 = local_58;
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_58 == (undefined8 *)0x0) {
        pSVar8 = "";
      }
      else {
        pSVar8 = (SEARCH_METHODS *)*local_58;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                 ,0x3e,(char *)pSVar8);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    }
    else {
      if (local_58 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_58 != local_58 + 2) {
          operator_delete((undefined8 *)*local_58);
        }
        operator_delete(puVar2);
      }
      pdVar7 = (double *)aom_memalign(0x10,(long)this->txfm2d_size_ << 3);
      this->ref_input_ = pdVar7;
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<double*,decltype(nullptr)>
                (local_60,"ref_input_","nullptr",&this->ref_input_,&local_70._M_head_impl);
      puVar2 = local_58;
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_58 == (undefined8 *)0x0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = (SEARCH_METHODS *)*local_58;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                   ,0x41,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      }
      else {
        if (local_58 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_58 != local_58 + 2) {
            operator_delete((undefined8 *)*local_58);
          }
          operator_delete(puVar2);
        }
        pdVar7 = (double *)aom_memalign(0x10,(long)this->txfm2d_size_ << 3);
        this->ref_output_ = pdVar7;
        local_70._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperNE<double*,decltype(nullptr)>
                  (local_60,"ref_output_","nullptr",&this->ref_output_,&local_70._M_head_impl);
        if (local_60[0] != (internal)0x0) goto LAB_006bad6d;
        testing::Message::Message((Message *)&local_70);
        if (local_58 == (undefined8 *)0x0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = (SEARCH_METHODS *)*local_58;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                   ,0x44,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
LAB_006bad6d:
  if (local_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_58 != local_58 + 2) {
      operator_delete((undefined8 *)*local_58);
    }
    operator_delete(local_58);
  }
  return;
}

Assistant:

void SetUp() override {
    tx_type_ = GET_PARAM(0);
    tx_size_ = GET_PARAM(1);
    max_error_ = GET_PARAM(2);
    max_avg_error_ = GET_PARAM(3);
    count_ = 500;
    TXFM_2D_FLIP_CFG fwd_txfm_flip_cfg;
    av1_get_fwd_txfm_cfg(tx_type_, tx_size_, &fwd_txfm_flip_cfg);
    amplify_factor_ = libaom_test::get_amplification_factor(tx_type_, tx_size_);
    tx_width_ = tx_size_wide[fwd_txfm_flip_cfg.tx_size];
    tx_height_ = tx_size_high[fwd_txfm_flip_cfg.tx_size];
    ud_flip_ = fwd_txfm_flip_cfg.ud_flip;
    lr_flip_ = fwd_txfm_flip_cfg.lr_flip;

    fwd_txfm_ = libaom_test::fwd_txfm_func_ls[tx_size_];
    txfm2d_size_ = tx_width_ * tx_height_;
    input_ = reinterpret_cast<int16_t *>(
        aom_memalign(16, sizeof(input_[0]) * txfm2d_size_));
    ASSERT_NE(input_, nullptr);
    output_ = reinterpret_cast<int32_t *>(
        aom_memalign(16, sizeof(output_[0]) * txfm2d_size_));
    ASSERT_NE(output_, nullptr);
    ref_input_ = reinterpret_cast<double *>(
        aom_memalign(16, sizeof(ref_input_[0]) * txfm2d_size_));
    ASSERT_NE(ref_input_, nullptr);
    ref_output_ = reinterpret_cast<double *>(
        aom_memalign(16, sizeof(ref_output_[0]) * txfm2d_size_));
    ASSERT_NE(ref_output_, nullptr);
  }